

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  _Base_ptr *config;
  bool bVar1;
  TargetType TVar2;
  string pdbSupportVar;
  string language;
  cmAlphaNum local_110;
  undefined1 local_e0 [48];
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&local_110,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e0,"TARGET_PDB_FILE not allowed for IMPORTED targets.",
               (allocator<char> *)&local_50);
    reportError((cmGeneratorExpressionContext *)target,(string *)&local_110,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  config = &(target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cmGeneratorTarget::GetLinkerLanguage(&local_50,(cmGeneratorTarget *)this,(string *)config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
                 "CMAKE_",&local_50);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
                 "_LINKER_SUPPORTS_PDB");
  std::__cxx11::string::~string((string *)&local_110);
  bVar1 = cmMakefile::IsOn(*(cmMakefile **)
                            (*(long *)&(target->Objects)._M_t._M_impl.super__Rb_tree_header.
                                       _M_header + 0x70),&local_70);
  if (bVar1) {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if ((TVar2 < OBJECT_LIBRARY) && (TVar2 != STATIC_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory(&local_b0,(cmGeneratorTarget *)this,(string *)config);
      local_110.View_._M_len = local_b0._M_string_length;
      local_110.View_._M_str = local_b0._M_dataplus._M_p;
      local_e0._8_8_ = local_e0 + 0x10;
      local_e0._0_8_ = &DAT_00000001;
      local_e0[0x10] = '/';
      cmGeneratorTarget::GetPDBName(&local_90,(cmGeneratorTarget *)this,(string *)config);
      cmStrCat<std::__cxx11::string>
                (__return_storage_ptr__,&local_110,(cmAlphaNum *)local_e0,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_004230f1;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&local_110,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e0,
               "TARGET_PDB_FILE is allowed only for targets with linker created artifacts.",
               (allocator<char> *)&local_b0);
    reportError((cmGeneratorExpressionContext *)target,(string *)&local_110,(string *)local_e0);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&local_110,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e0,"TARGET_PDB_FILE is not supported by the target linker.",
               (allocator<char> *)&local_b0);
    reportError((cmGeneratorExpressionContext *)target,(string *)&local_110,(string *)local_e0);
  }
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)&local_110);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_004230f1:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    if (target->IsImported()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE not allowed for IMPORTED targets.");
      return std::string();
    }

    std::string language = target->GetLinkerLanguage(context->Config);

    std::string pdbSupportVar = "CMAKE_" + language + "_LINKER_SUPPORTS_PDB";

    if (!context->LG->GetMakefile()->IsOn(pdbSupportVar)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is not supported by the target linker.");
      return std::string();
    }

    cmStateEnums::TargetType targetType = target->GetType();

    if (targetType != cmStateEnums::SHARED_LIBRARY &&
        targetType != cmStateEnums::MODULE_LIBRARY &&
        targetType != cmStateEnums::EXECUTABLE) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is allowed only for "
                    "targets with linker created artifacts.");
      return std::string();
    }

    std::string result = cmStrCat(target->GetPDBDirectory(context->Config),
                                  '/', target->GetPDBName(context->Config));
    return result;
  }